

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_turtle.cc
# Opt level: O3

void __thiscall PainterTest_CanDrawSomething_Test::TestBody(PainterTest_CanDrawSomething_Test *this)

{
  FunctionMocker<void_()> *this_00;
  TypedExpectation<void_()> *this_01;
  MockTurtle turtle;
  Cardinality local_230;
  MockSpec<void_()> local_220;
  MockTurtle local_210;
  
  MockTurtle::MockTurtle(&local_210);
  this_00 = &local_210.gmock00_PenDown_12;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            (&this_00->super_UntypedFunctionMockerBase,&local_210);
  local_220.function_mocker_ = this_00;
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::MockSpec<void_()>::InternalExpectedAt
                      (&local_220,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/Ed-Yang[P]gturtle/tests/test_turtle.cc"
                       ,0xb,"turtle","PenDown()");
  testing::AtLeast((testing *)&local_230,1);
  testing::internal::ExpectationBase::UntypedTimes(&this_01->super_ExpectationBase,&local_230);
  if (local_230.impl_.
      super___shared_ptr<const_testing::CardinalityInterface,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_230.impl_.
               super___shared_ptr<const_testing::CardinalityInterface,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  (*local_210.super_Turtle._vptr_Turtle[3])();
  local_210.super_Turtle._vptr_Turtle = (_func_int **)&PTR__MockTurtle_00164618;
  testing::internal::FunctionMocker<int_()>::~FunctionMocker(&local_210.gmock10_GetY_17);
  testing::internal::FunctionMocker<int_()>::~FunctionMocker(&local_210.gmock10_GetX_16);
  testing::internal::FunctionMocker<void_(int,_int)>::~FunctionMocker(&local_210.gmock02_GoTo_15);
  testing::internal::FunctionMocker<void_(int)>::~FunctionMocker(&local_210.gmock01_Turn_14);
  testing::internal::FunctionMocker<void_(int)>::~FunctionMocker(&local_210.gmock01_Forward_13);
  testing::internal::FunctionMocker<void_()>::~FunctionMocker(this_00);
  testing::internal::FunctionMocker<void_()>::~FunctionMocker(&local_210.gmock00_PenUp_11);
  return;
}

Assistant:

TEST(PainterTest, CanDrawSomething)
{
    MockTurtle turtle;             // #2

    EXPECT_CALL(turtle, PenDown()) // #3
        .Times(AtLeast(1));

    Painter painter(&turtle); // #4

    EXPECT_TRUE(painter.DrawCircle(0, 0, 10));
}